

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O1

double chrono::VangleRX<double>(ChVector<double> *va)

{
  double dVar1;
  undefined8 uVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 extraout_var [56];
  
  dVar3 = va->m_data[1];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = va->m_data[2];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar3 * dVar3;
  auVar4 = vfmadd231sd_fma(auVar4,auVar7,auVar7);
  if (auVar4._0_8_ < 0.0) {
    auVar5._0_8_ = sqrt(auVar4._0_8_);
    auVar5._8_56_ = extraout_var;
    auVar4 = auVar5._0_16_;
  }
  else {
    auVar4 = vsqrtsd_avx(auVar4,auVar4);
  }
  if (2.2250738585072014e-308 <= auVar4._0_8_) {
    dVar6 = 1.0 / auVar4._0_8_;
    dVar1 = dVar6 * 0.0;
    if ((dVar1 != 1.0) || (NAN(dVar1))) {
      uVar2 = vcmpsd_avx512f(auVar4,ZEXT816(0x10000000000000),1);
      dVar3 = acos((double)((ulong)!(bool)((byte)uVar2 & 1) * (long)(dVar3 * dVar6)));
      return dVar3;
    }
  }
  return 0.0;
}

Assistant:

double VangleRX(const ChVector<RealA>& va) {
    Vector vproj;
    vproj.x() = 0;
    vproj.y() = va.y();
    vproj.z() = va.z();
    vproj = Vnorm(vproj);
    if (vproj.x() == 1)
        return 0;
    return acos(vproj.y());
}